

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O0

void attoAppInit(AAppProctable *proctable)

{
  AAppProctable *ctx;
  AAppProctable *proctable_local;
  
  ctx = proctable;
  aGLInit();
  init((EVP_PKEY_CTX *)ctx);
  proctable->resize = resize;
  proctable->paint = paint;
  proctable->key = keyPress;
  return;
}

Assistant:

void attoAppInit(struct AAppProctable *proctable) {
	aGLInit();
	init();

	proctable->resize = resize;
	proctable->paint = paint;
	proctable->key = keyPress;
}